

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIBase64ValueImpl::~FIBase64ValueImpl(FIBase64ValueImpl *this)

{
  (this->super_FIBase64Value).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008bc960;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIByteValue::~FIByteValue((FIByteValue *)this);
  return;
}

Assistant:

inline FIBase64ValueImpl(std::vector<uint8_t> &&value_): strValueValid(false) { value = std::move(value_); }